

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O2

deUint64 __thiscall
deqp::gles2::Performance::anon_unknown_0::DrawCallBatchingTest::renderUnbatched
          (DrawCallBatchingTest *this)

{
  bool bVar1;
  code *pcVar2;
  int iVar3;
  undefined4 uVar4;
  GLint GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  pointer puVar8;
  deUint64 dVar9;
  int attribNdx;
  long lVar10;
  long lVar11;
  int drawNdx;
  long lVar12;
  int local_a0;
  GLint location;
  vector<int,_std::allocator<int>_> dynamicAttributeLocations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  deUint64 local_60;
  deUint64 local_58;
  string local_50;
  long lVar7;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(lVar7 + 0x1a00))(0,0,0x20);
  (**(code **)(lVar7 + 0x1680))((this->m_program->m_program).m_program);
  for (local_a0 = 0; local_a0 < (this->m_spec).staticAttributeCount; local_a0 = local_a0 + 1) {
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar6 = (this->m_program->m_program).m_program;
    de::toString<int>(&local_50,&local_a0);
    std::operator+(&local_80,"a_static",&local_50);
    uVar4 = (*pcVar2)(dVar6,local_80._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    (**(code **)(lVar7 + 0x610))(uVar4);
    if ((this->m_spec).useStaticBuffer == true) {
      (**(code **)(lVar7 + 0x40))
                (0x8892,(this->m_unbatchedStaticBuffers).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[local_a0]);
      (**(code **)(lVar7 + 0x19f0))(uVar4,4,0x1400,1);
      (**(code **)(lVar7 + 0x40))(0x8892,0);
    }
    else {
      (**(code **)(lVar7 + 0x19f0))(uVar4,4,0x1400,1);
    }
  }
  for (local_a0 = 0; local_a0 < (this->m_spec).dynamicAttributeCount; local_a0 = local_a0 + 1) {
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar6 = (this->m_program->m_program).m_program;
    de::toString<int>(&local_50,&local_a0);
    std::operator+(&local_80,"a_dyn",&local_50);
    GVar5 = (*pcVar2)(dVar6,local_80._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    location = GVar5;
    (**(code **)(lVar7 + 0x610))(GVar5);
    std::vector<int,_std::allocator<int>_>::push_back(&dynamicAttributeLocations,&location);
  }
  if ((((this->m_spec).useDrawElements != false) && ((this->m_spec).useIndexBuffer == true)) &&
     ((this->m_spec).dynamicIndices == false)) {
    (**(code **)(lVar7 + 0x40))(0x8893,this->m_unbatchedStaticIndexBuffer);
  }
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Failed to setup initial state for rendering.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x268);
  (**(code **)(lVar7 + 0x648))();
  local_58 = deGetMicroseconds();
  for (lVar12 = 0; lVar12 < (this->m_spec).drawCallCount; lVar12 = lVar12 + 1) {
    lVar11 = 0;
    for (lVar10 = 0; lVar10 < (this->m_spec).dynamicAttributeCount; lVar10 = lVar10 + 1) {
      if ((this->m_spec).useDynamicBuffer == true) {
        (**(code **)(lVar7 + 0x40))
                  (0x8892,*(undefined4 *)
                           (*(long *)((long)&(((this->m_unbatchedDynamicBuffers).
                                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_start + lVar11) +
                           lVar12 * 4));
        (**(code **)(lVar7 + 0x19f0))
                  (dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10],4,0x1400,1,0,0);
        (**(code **)(lVar7 + 0x40))(0x8892);
      }
      else {
        (**(code **)(lVar7 + 0x19f0))
                  (dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10],4,0x1400,1,0,
                   (long)((this->m_spec).triangleCount * (int)lVar12 * 0xc) +
                   *(long *)((long)&(((this->m_dynamicAttributeDatas).
                                      super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar11));
      }
      lVar11 = lVar11 + 0x18;
    }
    if ((this->m_spec).useDrawElements == false) {
      (**(code **)(lVar7 + 0x538))(4,0,(this->m_spec).triangleCount * 3);
    }
    else {
      bVar1 = (this->m_spec).dynamicIndices;
      if ((this->m_spec).useIndexBuffer == true) {
        if (bVar1 == false) {
          (**(code **)(lVar7 + 0x568))(4,(this->m_spec).triangleCount * 3,0x1401,0);
        }
        else {
          (**(code **)(lVar7 + 0x40))
                    (0x8893,(this->m_unbatchedDynamicIndexBuffers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar12]);
          (**(code **)(lVar7 + 0x568))(4,(this->m_spec).triangleCount * 3,0x1401,0);
          (**(code **)(lVar7 + 0x40))(0x8893);
        }
      }
      else {
        iVar3 = (this->m_spec).triangleCount;
        if (bVar1 == false) {
          puVar8 = (this->m_staticIndexData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          puVar8 = (this->m_dynamicIndexData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + (int)lVar12 * iVar3 * 3;
        }
        (**(code **)(lVar7 + 0x568))(4,iVar3 * 3,0x1401,puVar8);
      }
    }
  }
  (**(code **)(lVar7 + 0x648))();
  local_60 = deGetMicroseconds();
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Unbatched rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x299);
  (**(code **)(lVar7 + 0x40))(0x8893,0);
  for (local_a0 = 0; local_a0 < (this->m_spec).staticAttributeCount; local_a0 = local_a0 + 1) {
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar6 = (this->m_program->m_program).m_program;
    de::toString<int>(&local_50,&local_a0);
    std::operator+(&local_80,"a_static",&local_50);
    uVar4 = (*pcVar2)(dVar6,local_80._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_50);
    (**(code **)(lVar7 + 0x518))(uVar4);
  }
  for (lVar12 = 0; lVar12 < (this->m_spec).dynamicAttributeCount; lVar12 = lVar12 + 1) {
    (**(code **)(lVar7 + 0x518))
              (dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar12]);
  }
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Failed to reset state after unbatched rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pDrawCallBatchingTests.cpp"
                  ,0x2a6);
  dVar9 = local_60 - local_58;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&dynamicAttributeLocations.super__Vector_base<int,_std::allocator<int>_>);
  return dVar9;
}

Assistant:

deUint64 DrawCallBatchingTest::renderUnbatched (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	deUint64				beginUs	= 0;
	deUint64				endUs	= 0;
	vector<GLint>			dynamicAttributeLocations;

	gl.viewport(0, 0, 32, 32);
	gl.useProgram(m_program->getProgram());

	// Setup static buffers
	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);

		if (m_spec.useStaticBuffer)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, m_unbatchedStaticBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, NULL);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		}
		else
			gl.vertexAttribPointer(location, 4, GL_BYTE, GL_TRUE, 0, &(m_staticAttributeDatas[attribNdx][0]));
	}

	// Get locations of dynamic attributes
	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_dyn" + de::toString(attribNdx)).c_str());

		gl.enableVertexAttribArray(location);
		dynamicAttributeLocations.push_back(location);
	}

	if (m_spec.useDrawElements && m_spec.useIndexBuffer && !m_spec.dynamicIndices)
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_unbatchedStaticIndexBuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup initial state for rendering.");

	gl.finish();

	beginUs = deGetMicroseconds();

	for (int drawNdx = 0; drawNdx < m_spec.drawCallCount; drawNdx++)
	{
		for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		{
			if (m_spec.useDynamicBuffer)
			{
				gl.bindBuffer(GL_ARRAY_BUFFER, m_unbatchedDynamicBuffers[attribNdx][drawNdx]);
				gl.vertexAttribPointer(dynamicAttributeLocations[attribNdx], 4, GL_BYTE, GL_TRUE, 0, NULL);
				gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			}
			else
				gl.vertexAttribPointer(dynamicAttributeLocations[attribNdx], 4, GL_BYTE, GL_TRUE, 0, &(m_dynamicAttributeDatas[attribNdx][m_spec.triangleCount * 3 * drawNdx * 4]));
		}

		if (m_spec.useDrawElements)
		{
			if (m_spec.useIndexBuffer)
			{
				if (m_spec.dynamicIndices)
				{
					gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_unbatchedDynamicIndexBuffers[drawNdx]);
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, NULL);
					gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
				}
				else
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, NULL);
			}
			else
			{
				if (m_spec.dynamicIndices)
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, &(m_dynamicIndexData[drawNdx * m_spec.triangleCount * 3]));
				else
					gl.drawElements(GL_TRIANGLES, m_spec.triangleCount * 3, GL_UNSIGNED_BYTE, &(m_staticIndexData[0]));
			}
		}
		else
			gl.drawArrays(GL_TRIANGLES, 0, 3 * m_spec.triangleCount);
	}

	gl.finish();

	endUs = deGetMicroseconds();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Unbatched rendering failed");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

	for (int attribNdx = 0; attribNdx < m_spec.staticAttributeCount; attribNdx++)
	{
		GLint location = gl.getAttribLocation(m_program->getProgram(), ("a_static" + de::toString(attribNdx)).c_str());
		gl.disableVertexAttribArray(location);
	}

	for (int attribNdx = 0; attribNdx < m_spec.dynamicAttributeCount; attribNdx++)
		gl.disableVertexAttribArray(dynamicAttributeLocations[attribNdx]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to reset state after unbatched rendering");

	return endUs - beginUs;
}